

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__gif_info_raw(stbi__context *s,int *x,int *y,int *comp)

{
  int iVar1;
  stbi__gif *g_00;
  stbi__gif *g;
  int *comp_local;
  int *y_local;
  int *x_local;
  stbi__context *s_local;
  
  g_00 = (stbi__gif *)stbi__malloc(0x8870);
  if (g_00 == (stbi__gif *)0x0) {
    s_local._4_4_ = stbi__err("outofmem");
  }
  else {
    iVar1 = stbi__gif_header(s,g_00,comp,1);
    if (iVar1 == 0) {
      free(g_00);
      stbi__rewind(s);
      s_local._4_4_ = 0;
    }
    else {
      if (x != (int *)0x0) {
        *x = g_00->w;
      }
      if (y != (int *)0x0) {
        *y = g_00->h;
      }
      free(g_00);
      s_local._4_4_ = 1;
    }
  }
  return s_local._4_4_;
}

Assistant:

static int stbi__gif_info_raw(stbi__context *s, int *x, int *y, int *comp)
{
   stbi__gif* g = (stbi__gif*) stbi__malloc(sizeof(stbi__gif));
   if (!g) return stbi__err("outofmem", "Out of memory");
   if (!stbi__gif_header(s, g, comp, 1)) {
      STBI_FREE(g);
      stbi__rewind( s );
      return 0;
   }
   if (x) *x = g->w;
   if (y) *y = g->h;
   STBI_FREE(g);
   return 1;
}